

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_24::CSharpCodeGenerator::~CSharpCodeGenerator(CSharpCodeGenerator *this)

{
  CSharpCodeGenerator *this_local;
  
  ~CSharpCodeGenerator(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateCSharp(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }